

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O0

void __thiscall cmGraphVizWriter::WritePerTargetFiles(cmGraphVizWriter *this,char *fileName)

{
  const_iterator cVar1;
  bool bVar2;
  byte bVar3;
  TargetType targetType;
  pointer ppVar4;
  char *name;
  ostream *poVar5;
  undefined1 local_318 [8];
  cmGeneratedFileStream str;
  allocator local_b9;
  string local_b8 [8];
  string currentFilename;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  insertedNodes;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  insertedConnections;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmTarget_*>_>
  local_30;
  iterator local_28;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmTarget_*>_>
  local_20;
  const_iterator ptrIt;
  char *fileName_local;
  cmGraphVizWriter *this_local;
  
  if ((this->GeneratePerTarget & 1U) != 0) {
    ptrIt._M_node = (_Base_ptr)fileName;
    CollectTargetsAndLibs(this);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmTarget_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmTarget_*>_>_>
         ::begin(&this->TargetPtrs);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmTarget_*>_>
    ::_Rb_tree_const_iterator(&local_20,&local_28);
    while( true ) {
      insertedConnections._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmTarget_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmTarget_*>_>_>
                   ::end(&this->TargetPtrs);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmTarget_*>_>
      ::_Rb_tree_const_iterator
                (&local_30,
                 (iterator *)&insertedConnections._M_t._M_impl.super__Rb_tree_header._M_node_count);
      bVar2 = std::operator!=(&local_20,&local_30);
      if (!bVar2) break;
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmTarget_*>_>
               ::operator->(&local_20);
      if (ppVar4->second != (cmTarget *)0x0) {
        ppVar4 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmTarget_*>_>
                 ::operator->(&local_20);
        targetType = cmTarget::GetType(ppVar4->second);
        bVar2 = GenerateForTargetType(this,targetType);
        if (bVar2) {
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&insertedNodes._M_t._M_impl.super__Rb_tree_header._M_node_count);
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&currentFilename.field_2 + 8));
          cVar1 = ptrIt;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_b8,(char *)cVar1._M_node,&local_b9);
          std::allocator<char>::~allocator((allocator<char> *)&local_b9);
          std::__cxx11::string::operator+=(local_b8,".");
          ppVar4 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmTarget_*>_>
                   ::operator->(&local_20);
          std::__cxx11::string::operator+=(local_b8,(string *)ppVar4);
          name = (char *)std::__cxx11::string::c_str();
          cmGeneratedFileStream::cmGeneratedFileStream
                    ((cmGeneratedFileStream *)local_318,name,false);
          bVar3 = std::ios::operator!((ios *)(local_318 +
                                             (long)*(_func_int **)((long)local_318 + -0x18)));
          bVar2 = (bVar3 & 1) != 0;
          if (!bVar2) {
            poVar5 = std::operator<<((ostream *)&std::cout,"Writing ");
            poVar5 = std::operator<<(poVar5,local_b8);
            poVar5 = std::operator<<(poVar5,"...");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            WriteHeader(this,(cmGeneratedFileStream *)local_318);
            ppVar4 = std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmTarget_*>_>
                     ::operator->(&local_20);
            WriteConnections(this,&ppVar4->first,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)((long)&currentFilename.field_2 + 8),
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&insertedNodes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             (cmGeneratedFileStream *)local_318);
            WriteFooter(this,(cmGeneratedFileStream *)local_318);
          }
          cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_318);
          std::__cxx11::string::~string(local_b8);
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&currentFilename.field_2 + 8));
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&insertedNodes._M_t._M_impl.super__Rb_tree_header._M_node_count);
          if (bVar2) {
            return;
          }
        }
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmTarget_*>_>
      ::operator++(&local_20);
    }
  }
  return;
}

Assistant:

void cmGraphVizWriter::WritePerTargetFiles(const char* fileName)
{
  if(this->GeneratePerTarget == false)
    {
    return;
    }

  this->CollectTargetsAndLibs();

  for(std::map<std::string, const cmTarget*>::const_iterator ptrIt =
                                                      this->TargetPtrs.begin();
      ptrIt != this->TargetPtrs.end();
      ++ptrIt)
    {
    if (ptrIt->second == NULL)
      {
      continue;
      }

    if (this->GenerateForTargetType(ptrIt->second->GetType()) == false)
      {
      continue;
      }

    std::set<std::string> insertedConnections;
    std::set<std::string> insertedNodes;

    std::string currentFilename = fileName;
    currentFilename += ".";
    currentFilename += ptrIt->first;
    cmGeneratedFileStream str(currentFilename.c_str());
    if ( !str )
      {
      return;
      }

    std::cout << "Writing " << currentFilename << "..." << std::endl;
    this->WriteHeader(str);

    this->WriteConnections(ptrIt->first,
                              insertedNodes, insertedConnections, str);
    this->WriteFooter(str);
    }

}